

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor.cpp
# Opt level: O0

char * cbor_print_bytes_part(char *out,char *out_max,uint8_t *in,int64_t val)

{
  byte bVar1;
  int iVar2;
  char *pcVar3;
  long lStack_30;
  int c;
  int64_t i;
  int64_t val_local;
  uint8_t *in_local;
  char *out_max_local;
  char *out_local;
  
  out_max_local = out;
  for (lStack_30 = 0; lStack_30 < val && out_max_local + 1 < out_max; lStack_30 = lStack_30 + 1) {
    bVar1 = in[lStack_30];
    iVar2 = hex_to_char((int)(uint)bVar1 >> 4);
    pcVar3 = out_max_local + 1;
    *out_max_local = (char)iVar2;
    iVar2 = hex_to_char((uint)bVar1);
    out_max_local = out_max_local + 2;
    *pcVar3 = (char)iVar2;
  }
  return out_max_local;
}

Assistant:

char* cbor_print_bytes_part(char* out, char const* out_max, uint8_t* in, int64_t val)
{
    for (int64_t i = 0; i < val && out + 1 < out_max; i++) {
        int c = in[i];
        *out++ = hex_to_char(c >> 4);
		*out++ = hex_to_char(c);
    }

    return out;
}